

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall
cmMakefile::AddLinkLibraryForTarget(cmMakefile *this,string *target,string *lib,LinkLibraryType llt)

{
  bool bVar1;
  iterator iVar2;
  cmTarget *this_00;
  ostream *poVar3;
  char *pcVar4;
  string local_1c8;
  ostringstream e;
  
  iVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->Targets)._M_h,target);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
      ._M_cur == (__node_type *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar3 = std::operator<<((ostream *)&e,"Attempt to add link library \"");
    poVar3 = std::operator<<(poVar3,(string *)lib);
    poVar3 = std::operator<<(poVar3,"\" to target \"");
    poVar3 = std::operator<<(poVar3,(string *)target);
    std::operator<<(poVar3,"\" which is not built in this directory.");
    std::__cxx11::stringbuf::str();
    IssueMessage(this,FATAL_ERROR,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  }
  else {
    this_00 = cmGlobalGenerator::FindTarget(this->LocalGenerator->GlobalGenerator,lib,false);
    if ((this_00 != (cmTarget *)0x0) &&
       ((INTERFACE_LIBRARY < this_00->TargetTypeValue ||
        ((0x86U >> (this_00->TargetTypeValue & 0x1f) & 1) == 0)))) {
      bVar1 = cmTarget::IsExecutableWithExports(this_00);
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar3 = std::operator<<((ostream *)&e,"Target \"");
        poVar3 = std::operator<<(poVar3,(string *)lib);
        poVar3 = std::operator<<(poVar3,"\" of type ");
        pcVar4 = cmTarget::GetTargetTypeName(this_00->TargetTypeValue);
        poVar3 = std::operator<<(poVar3,pcVar4);
        poVar3 = std::operator<<(poVar3," may not be linked into another target.  ");
        poVar3 = std::operator<<(poVar3,"One may link only to STATIC or SHARED libraries, or ");
        std::operator<<(poVar3,"to executables with the ENABLE_EXPORTS property set.");
        std::__cxx11::stringbuf::str();
        IssueMessage(this,FATAL_ERROR,&local_1c8);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      }
    }
    cmTarget::AddLinkLibrary
              ((cmTarget *)
               ((long)iVar2.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                      ._M_cur + 0x28),this,target,lib,llt);
  }
  return;
}

Assistant:

void cmMakefile::AddLinkLibraryForTarget(const std::string& target,
                                         const std::string& lib,
                                         cmTarget::LinkLibraryType llt)
{
  cmTargets::iterator i = this->Targets.find(target);
  if ( i != this->Targets.end())
    {
    cmTarget* tgt = this->GetGlobalGenerator()->FindTarget(lib);
    if(tgt)
      {
      // if it is not a static or shared library then you can not link to it
      if(!((tgt->GetType() == cmTarget::STATIC_LIBRARY) ||
           (tgt->GetType() == cmTarget::SHARED_LIBRARY) ||
           (tgt->GetType() == cmTarget::INTERFACE_LIBRARY) ||
           tgt->IsExecutableWithExports()))
        {
        std::ostringstream e;
        e << "Target \"" << lib << "\" of type "
          << cmTarget::GetTargetTypeName(tgt->GetType())
          << " may not be linked into another target.  "
          << "One may link only to STATIC or SHARED libraries, or "
          << "to executables with the ENABLE_EXPORTS property set.";
        this->IssueMessage(cmake::FATAL_ERROR, e.str());
        }
      }
    i->second.AddLinkLibrary( *this, target, lib, llt );
    }
  else
    {
    std::ostringstream e;
    e << "Attempt to add link library \""
      << lib << "\" to target \""
      << target << "\" which is not built in this directory.";
    this->IssueMessage(cmake::FATAL_ERROR, e.str());
    }
}